

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O1

void __thiscall
optimization::inlineFunc::Inline_Func::optimize_func
          (Inline_Func *this,string *funcId,MirFunction *func,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          *funcTable)

{
  string *__k;
  pointer *ppuVar1;
  undefined1 uVar2;
  JumpKind JVar3;
  CallInst *callInst;
  pointer puVar4;
  Inst *pIVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *pmVar8;
  mapped_type *pmVar9;
  MirFunction *func_00;
  int iVar10;
  _Base_ptr p_Var11;
  mapped_type *this_00;
  const_iterator cVar12;
  size_t sVar13;
  size_t sVar14;
  ostream *poVar15;
  _Rb_tree_node_base *p_Var16;
  mapped_type *pmVar17;
  long lVar18;
  mapped_type *pmVar19;
  mapped_type *pmVar20;
  _Rb_tree_node_base *p_Var21;
  _Rb_tree_color _Var22;
  iterator __begin2;
  ulong uVar23;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j_1;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar24;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar25;
  Tag *tag;
  char *function;
  _Self __tmp;
  _Rb_tree_header *p_Var26;
  pointer puVar27;
  pointer puVar28;
  _Base_ptr p_Var29;
  bool bVar30;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar31;
  ulong uVar32;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar33;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  pVar34;
  int bb_true;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  start_blk_insts;
  mapped_type sub_start_id;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  end_blk_insts;
  int bb_false;
  mapped_type sub_end_id;
  Rewriter rwt;
  set<int,_std::less<int>,_std::allocator<int>_> base_labels;
  uint local_214;
  uint32_t local_210;
  uint32_t local_20c;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_208;
  undefined8 uStack_1f0;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_1e0;
  char *local_1d8;
  _Base_ptr local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_1b8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> local_1a0 [2];
  undefined1 local_190;
  _Rb_tree_node_base *local_188;
  _Base_ptr *local_180;
  MirFunction *local_178;
  long local_170;
  _Rb_tree_color local_168;
  int local_164;
  mapped_type *local_160;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_158;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_150;
  _Base_ptr local_148;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *local_138;
  undefined **local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0 [16];
  size_t local_d0;
  bool local_c8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_a8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_90 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_138 = funcTable;
  iVar10 = std::__cxx11::string::compare((char *)&func->name);
  if ((iVar10 != 0) &&
     (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern == false)) {
    p_Var11 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    _Var22 = p_Var11[1]._M_color;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_188 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var11 != local_188) {
      do {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,(int *)(p_Var11 + 1));
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != local_188);
    }
    local_1e0 = &func->basic_blks;
    local_140 = &this->uninlineable_funcs;
    local_148 = &(this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_150 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->uninlined_funcs;
    p_Var16 = local_188;
    local_178 = func;
    do {
      p_Var21 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var21 != p_Var16) {
        do {
          if ((int)p_Var21[1]._M_color < (int)_Var22) {
LAB_001244cc:
            bVar30 = false;
          }
          else {
            p_Var11 = p_Var21[3]._M_parent;
            if (p_Var21[3]._M_left == p_Var11) {
              bVar30 = false;
            }
            else {
              local_158 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                           *)&p_Var21[3]._M_parent;
              local_180 = &p_Var21[1]._M_left;
              local_170 = 8;
              uVar32 = 0;
              bVar30 = false;
              local_168 = _Var22;
              do {
                iVar10 = (**(code **)(**(long **)(&p_Var11->_M_color + uVar32 * 2) + 8))();
                bVar7 = true;
                if (iVar10 == 6) {
                  callInst = *(CallInst **)(&p_Var11->_M_color + uVar32 * 2);
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                            ::at(local_138,&callInst->func);
                  __k = &this_00->name;
                  tag = (Tag *)__k;
                  cVar12 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find(&local_140->_M_t,__k);
                  if ((cVar12._M_node == local_148) &&
                     (((this_00->type).
                       super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->is_extern == false)) {
                    sVar13 = mir::inst::MirFunction::variable_table_size(this_00);
                    sVar14 = mir::inst::MirFunction::variable_table_size(local_178);
                    if (sVar14 + sVar13 < 0x400) {
                      local_214 = local_214 & 0xffffff00;
                      AixLog::operator<<((ostream *)&local_214,(Severity *)tag);
                      local_1b8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
                      local_1b8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = local_1a0;
                      local_1b8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_1a0[0]._M_t.
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._0_1_ = 0;
                      local_190 = 1;
                      AixLog::operator<<((ostream *)&local_1b8,tag);
                      func_00 = local_178;
                      ppuVar1 = &local_208.
                                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      local_128 = std::chrono::_V2::system_clock::now();
                      local_130 = &PTR__Timestamp_001edeb0;
                      local_120 = 0;
                      AixLog::operator<<((ostream *)&local_130,(Timestamp *)tag);
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_208,"optimize_func","");
                      local_1d8 = &local_1c8;
                      function = 
                      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
                      ;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1d8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
                                 ,"");
                      local_118._0_8_ = &PTR__Function_001edf10;
                      local_118._8_8_ = local_108 + 8;
                      if (local_208.
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == (pointer)ppuVar1) {
                        local_100._8_8_ = uStack_1f0;
                      }
                      else {
                        local_118._8_8_ =
                             local_208.
                             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                      }
                      local_100._M_allocated_capacity =
                           (size_type)
                           local_208.
                           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      local_108 = (undefined1  [8])
                                  local_208.
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)((ulong)local_208.
                                            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                    0xffffffffffffff00);
                      local_f0._M_p = local_e0;
                      if (local_1d8 == &local_1c8) {
                        local_e0._8_8_ = uStack_1c0;
                      }
                      else {
                        local_f0._M_p = local_1d8;
                      }
                      local_e0._1_7_ = uStack_1c7;
                      local_e0[0] = local_1c8;
                      local_e8 = local_1d0;
                      local_1d0 = (_Base_ptr)0x0;
                      local_1c8 = '\0';
                      local_d0 = 0x13d;
                      local_c8 = false;
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
                      local_1d8 = &local_1c8;
                      AixLog::operator<<((ostream *)local_118,(Function *)function);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::clog,"( inline_func ) ",0x10);
                      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::clog,(func_00->name)._M_dataplus._M_p,
                                           (func_00->name)._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar15," inlines ",9);
                      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar15,(this_00->name)._M_dataplus._M_p,
                                           (this_00->name)._M_string_length);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) +
                                      (char)poVar15);
                      std::ostream::put((char)poVar15);
                      std::ostream::flush();
                      AixLog::Function::~Function((Function *)local_118);
                      if (local_1d8 != &local_1c8) {
                        operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
                      }
                      if (local_208.
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar1) {
                        operator_delete(local_208.
                                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((local_208.
                                                                                                                  
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_t).
                                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                  _M_head_impl + 1));
                      }
                      local_1b8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
                      if (local_1b8.
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish != local_1a0) {
                        operator_delete(local_1b8.
                                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        CONCAT71(local_1a0[0]._M_t.
                                                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                 _M_head_impl._1_7_,
                                                 local_1a0[0]._M_t.
                                                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                 _M_head_impl._0_1_) + 1);
                      }
                      Rewriter::Rewriter((Rewriter *)local_118,func_00,this_00,callInst,
                                         *(int *)local_180);
                      p_Var26 = &(this_00->basic_blks)._M_t._M_impl.super__Rb_tree_header;
                      for (p_Var16 = (this_00->basic_blks)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header._M_left; (_Rb_tree_header *)p_Var16 != p_Var26;
                          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
                        Rewriter::cast_block
                                  ((Rewriter *)local_118,(BasicBlk *)&p_Var16[1]._M_parent);
                      }
                      pmVar17 = std::
                                map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                ::at((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                      *)(local_e0 + 8),
                                     (key_type *)
                                     ((this_00->basic_blks)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_left + 1));
                      local_1d8 = (char *)CONCAT44(local_1d8._4_4_,*pmVar17);
                      lVar18 = std::_Rb_tree_decrement(&p_Var26->_M_header);
                      pmVar17 = std::
                                map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                ::at((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                      *)(local_e0 + 8),(key_type *)(lVar18 + 0x20));
                      pmVar8 = local_1e0;
                      local_130 = (undefined **)CONCAT44(local_130._4_4_,*pmVar17);
                      pmVar19 = std::
                                map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                ::at(local_1e0,(key_type *)&local_1d8);
                      local_1b8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0
                      ;
                      local_1b8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0
                      ;
                      local_1b8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      pmVar20 = std::
                                map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                ::at(pmVar8,(key_type *)&local_130);
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>
                                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                  *)&local_60,(int *)&local_130);
                      puVar4 = (pmVar20->inst).
                               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      for (puVar28 = (pmVar20->inst).
                                     super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                          puVar27 = local_90[0].
                                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish, puVar28 != puVar4;
                          puVar28 = puVar28 + 1) {
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                    *)&local_1b8,puVar28);
                      }
                      local_160 = pmVar20;
                      lVar18 = local_170;
                      for (puVar24 = local_90[0].
                                     super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; uVar23 = uVar32,
                          local_170 = lVar18, puVar24 != puVar27; puVar24 = puVar24 + 1) {
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                    *)&local_1b8,puVar24);
                        lVar18 = local_170;
                      }
                      while( true ) {
                        uVar23 = uVar23 + 1;
                        if ((ulong)((long)p_Var21[3]._M_left - (long)p_Var21[3]._M_parent >> 3) <=
                            uVar23) break;
                        puVar24 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)((long)&(p_Var21[3]._M_parent)->_M_color + lVar18);
                        lVar18 = lVar18 + 8;
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                    *)&local_1b8,puVar24);
                      }
                      puVar28 = (local_160->inst).
                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      puVar4 = (local_160->inst).
                               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      puVar25 = local_1b8.
                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      puVar27 = puVar28;
                      pmVar9 = local_160;
                      puVar24 = local_1b8.
                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      if (puVar4 != puVar28) {
                        do {
                          pIVar5 = (puVar27->_M_t).
                                   super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                   .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                          if (pIVar5 != (Inst *)0x0) {
                            (*(pIVar5->super_Displayable)._vptr_Displayable[5])();
                          }
                          (puVar27->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                               (Inst *)0x0;
                          puVar27 = puVar27 + 1;
                        } while (puVar27 != puVar4);
                        (local_160->inst).
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = puVar28;
                        puVar25 = local_1b8.
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        pmVar9 = local_160;
                        puVar24 = local_1b8.
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      }
                      for (; puVar25 != puVar24; puVar25 = puVar25 + 1) {
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                    *)&pmVar20->inst,puVar25);
                      }
                      uVar2 = (undefined1)p_Var21[5]._M_color;
                      if (uVar2 == _S_black) {
                        local_20c = *(uint32_t *)&p_Var21[4]._M_right;
                      }
                      p_Var11 = p_Var21[5]._M_parent;
                      JVar3 = *(JumpKind *)&p_Var21[5]._M_left;
                      (pmVar9->jump).kind = *(JumpInstructionKind *)&p_Var21[4]._M_parent;
                      bVar30 = (pmVar9->jump).cond_or_ret.
                               super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                               super__Optional_payload_base<mir::inst::VarId>._M_engaged;
                      if ((bVar30 == true) && (uVar2 != _S_red)) {
                        (pmVar9->jump).cond_or_ret.
                        super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id =
                             local_20c;
                      }
                      else if (uVar2 == _S_red) {
                        if (bVar30 != false) {
                          (pmVar9->jump).cond_or_ret.
                          super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                          super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
                        }
                      }
                      else {
                        (pmVar9->jump).cond_or_ret.
                        super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.
                        super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
                        (pmVar9->jump).cond_or_ret.
                        super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id =
                             local_20c;
                        (pmVar9->jump).cond_or_ret.
                        super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                        super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
                      }
                      *(_Base_ptr *)&(pmVar9->jump).bb_true = p_Var11;
                      (pmVar9->jump).jump_kind = JVar3;
                      local_214 = *(uint *)&p_Var21[5]._M_parent;
                      if (local_214 != 0xffffffff) {
                        pmVar20 = std::
                                  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                  ::at(local_1e0,(key_type *)&local_214);
                        psVar31 = &pmVar20->preceding;
                        pVar33 = std::
                                 _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                 ::equal_range(&psVar31->_M_t,(key_type *)local_180);
                        std::
                        _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        ::_M_erase_aux(&psVar31->_M_t,(_Base_ptr)pVar33.first._M_node,
                                       (_Base_ptr)pVar33.second._M_node);
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)psVar31,&pmVar9->id);
                      }
                      local_164 = *(int *)((long)&p_Var21[5]._M_parent + 4);
                      if (local_164 != -1) {
                        pmVar20 = std::
                                  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                  ::at(local_1e0,&local_164);
                        psVar31 = &pmVar20->preceding;
                        pVar33 = std::
                                 _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                 ::equal_range(&psVar31->_M_t,(key_type *)local_180);
                        std::
                        _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        ::_M_erase_aux(&psVar31->_M_t,(_Base_ptr)pVar33.first._M_node,
                                       (_Base_ptr)pVar33.second._M_node);
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)psVar31,&pmVar9->id);
                      }
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0
                      ;
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0
                      ;
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      puVar24 = local_a8.
                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      puVar25 = local_a8.
                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      if (uVar32 != 0) {
                        lVar18 = 0;
                        uVar23 = uVar32;
                        do {
                          std::
                          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          ::
                          emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                      *)&local_208,
                                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      *)(*(long *)local_158 + lVar18));
                          lVar18 = lVar18 + 8;
                          uVar23 = uVar23 - 1;
                          puVar24 = local_a8.
                                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          puVar25 = local_a8.
                                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                        } while (uVar23 != 0);
                      }
                      for (; puVar28 = local_a8.
                                       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                          puVar24 !=
                          local_a8.
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; puVar24 = puVar24 + 1) {
                        local_a8.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = puVar25;
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                    *)&local_208,puVar24);
                        puVar25 = local_a8.
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                        local_a8.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = puVar28;
                      }
                      puVar4 = (pmVar19->inst).
                               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      local_a8.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = puVar25;
                      for (puVar28 = (pmVar19->inst).
                                     super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; puVar28 != puVar4;
                          puVar28 = puVar28 + 1) {
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                    *)&local_208,puVar28);
                      }
                      p_Var11 = p_Var21[3]._M_parent;
                      p_Var6 = p_Var21[3]._M_left;
                      p_Var29 = p_Var11;
                      puVar24 = local_208.
                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      puVar25 = local_208.
                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      pmVar8 = local_1e0;
                      if (p_Var6 != p_Var11) {
                        do {
                          if (*(long **)p_Var29 != (long *)0x0) {
                            (**(code **)(**(long **)p_Var29 + 0x28))();
                          }
                          *(long *)p_Var29 = 0;
                          p_Var29 = (_Base_ptr)&p_Var29->_M_parent;
                        } while (p_Var29 != p_Var6);
                        p_Var21[3]._M_left = p_Var11;
                        puVar24 = local_208.
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        puVar25 = local_208.
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                        pmVar8 = local_1e0;
                      }
                      for (; puVar28 = local_208.
                                       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                          local_1e0 = pmVar8,
                          puVar24 !=
                          local_208.
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; puVar24 = puVar24 + 1) {
                        local_208.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = puVar25;
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  (local_158,puVar24);
                        puVar25 = local_208.
                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                        pmVar8 = local_1e0;
                        local_208.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = puVar28;
                      }
                      bVar30 = (pmVar19->jump).cond_or_ret.
                               super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                               super__Optional_payload_base<mir::inst::VarId>._M_engaged;
                      if (bVar30 != false) {
                        local_210 = (pmVar19->jump).cond_or_ret.
                                    super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                                    super__Optional_payload_base<mir::inst::VarId>._M_payload.
                                    _M_value.id;
                      }
                      p_Var11 = *(_Base_ptr *)&(pmVar19->jump).bb_true;
                      JVar3 = (pmVar19->jump).jump_kind;
                      *(JumpInstructionKind *)&p_Var21[4]._M_parent = (pmVar19->jump).kind;
                      uVar2 = (undefined1)p_Var21[5]._M_color;
                      if ((uVar2 == _S_red) || (bVar30 == false)) {
                        if (bVar30 == false) {
                          if (uVar2 != _S_red) {
                            *(undefined1 *)&p_Var21[5]._M_color = _S_red;
                          }
                        }
                        else {
                          p_Var21[4]._M_left = (_Base_ptr)&PTR_display_001ee058;
                          *(uint32_t *)&p_Var21[4]._M_right = local_210;
                          *(undefined1 *)&p_Var21[5]._M_color = _S_black;
                        }
                      }
                      else {
                        *(uint32_t *)&p_Var21[4]._M_right = local_210;
                      }
                      p_Var21[5]._M_parent = p_Var11;
                      *(JumpKind *)&p_Var21[5]._M_left = JVar3;
                      local_208.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = puVar25;
                      pVar34 = std::
                               _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                               ::equal_range(&pmVar8->_M_t,(key_type *)&local_1d8);
                      std::
                      _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      ::_M_erase_aux(&pmVar8->_M_t,(_Base_ptr)pVar34.first._M_node,
                                     (_Base_ptr)pVar34.second._M_node);
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::~vector(&local_208);
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::~vector(&local_1b8);
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::~vector(local_90);
                      std::
                      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ::~vector(&local_a8);
                      std::
                      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)(local_e0 + 8));
                      std::
                      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_108);
                      bVar30 = true;
                      bVar7 = false;
                    }
                    else {
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>(local_150,__k);
                    }
                  }
                }
                p_Var16 = local_188;
                _Var22 = local_168;
                if (!bVar7) break;
                uVar32 = uVar32 + 1;
                p_Var11 = p_Var21[3]._M_parent;
                local_170 = local_170 + 8;
              } while (uVar32 < (ulong)((long)p_Var21[3]._M_left - (long)p_Var11 >> 3));
            }
            func = local_178;
            if (!bVar30) goto LAB_001244cc;
            _Var22 = p_Var21[1]._M_color;
            bVar30 = true;
          }
        } while ((!bVar30) &&
                (p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21),
                p_Var21 != p_Var16));
      }
    } while (p_Var21 != p_Var16);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
  }
  return;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func,
                     std::map<std::string, mir::inst::MirFunction>& funcTable) {
    if (func.name == "main" || func.type->is_extern) {
      return;
    }
    int cur_blkId = func.basic_blks.begin()->first;
    std::set<mir::types::LabelId> base_labels;
    for (auto& iter : func.basic_blks) {
      base_labels.insert(iter.first);
    }
    while (true) {
      auto iter = func.basic_blks.begin();
      for (; iter != func.basic_blks.end(); ++iter) {
        bool flag = false;
        if (iter->first < cur_blkId) {
          // if (iter->first < cur_blkId || !base_labels.count(iter->first)) {

          continue;
        }
        auto& insts = iter->second.inst;
        auto& cur_blk = iter->second;
        for (int i = 0; i < insts.size(); i++) {
          auto& inst = insts[i];
          if (inst->inst_kind() != mir::inst::InstKind::Call) {
            continue;
          }
          auto& iptr = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&iptr);
          auto& subfunc = funcTable.at(callInst->func);
          if (uninlineable_funcs.count(subfunc.name)) {
            continue;
          }
          if (subfunc.type->is_extern) {
            continue;
          }
          if (subfunc.variable_table_size() + func.variable_table_size() >=
              1024) {
            uninlined_funcs.insert(subfunc.name);
            continue;
          }
          //  Then this func is inlineable
          LOG(TRACE) << "( inline_func ) " << func.name << " inlines "
                     << subfunc.name << std::endl;
          Rewriter rwt(func, subfunc, *callInst, cur_blk.id);
          for (auto& pair : subfunc.basic_blks) {
            rwt.cast_block(pair.second);
          }
          auto sub_start_id =
              rwt.label_cast_map.at(subfunc.basic_blks.begin()->first);
          auto end_iter = subfunc.basic_blks.end();
          end_iter--;
          auto sub_end_id = rwt.label_cast_map.at(end_iter->first);
          auto& start_blk = func.basic_blks.at(sub_start_id);

          std::vector<std::unique_ptr<mir::inst::Inst>> end_blk_insts;
          auto& end_blk = func.basic_blks.at(sub_end_id);
          base_labels.insert(sub_end_id);
          for (auto& j : end_blk.inst) {
            end_blk_insts.push_back(std::move(j));
          }

          for (auto& j : rwt.init_inst_after) {
            end_blk_insts.push_back(std::move(j));
          }
          for (int j = i + 1; j < insts.size(); j++) {
            end_blk_insts.push_back(std::move(insts[j]));
          }
          end_blk.inst.clear();
          for (auto& j : end_blk_insts) {
            end_blk.inst.push_back(std::move(j));
          }
          end_blk.jump = mir::inst::JumpInstruction(
              cur_blk.jump.kind, cur_blk.jump.bb_true, cur_blk.jump.bb_false,
              cur_blk.jump.cond_or_ret, cur_blk.jump.jump_kind);
          int bb_true = cur_blk.jump.bb_true;
          if (bb_true != -1) {
            auto& blk = func.basic_blks.at(bb_true);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }
          int bb_false = cur_blk.jump.bb_false;
          if (bb_false != -1) {
            auto& blk = func.basic_blks.at(bb_false);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }

          std::vector<std::unique_ptr<mir::inst::Inst>> start_blk_insts;
          for (int j = 0; j < i; j++) {
            start_blk_insts.push_back(std::move(insts[j]));
          }
          for (auto& j : rwt.init_inst_before) {
            start_blk_insts.push_back(std::move(j));
          }
          for (auto& j : start_blk.inst) {
            start_blk_insts.push_back(std::move(j));
          }
          cur_blk.inst.clear();
          for (auto& j : start_blk_insts) {
            cur_blk.inst.push_back(std::move(j));
          }
          cur_blk.jump = mir::inst::JumpInstruction(
              start_blk.jump.kind, start_blk.jump.bb_true,
              start_blk.jump.bb_false, start_blk.jump.cond_or_ret,
              start_blk.jump.jump_kind);

          flag = true;
          func.basic_blks.erase(sub_start_id);
          break;
        }
        if (flag) {
          cur_blkId = iter->first;
          break;
        }
      }
      if (iter == func.basic_blks.end()) {
        break;
      }
    }
  }